

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mulhsu(TCGContext_conflict11 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2)

{
  TCGv_i64 rl;
  TCGv_i64 rh;
  uintptr_t o_1;
  uintptr_t o;
  
  rl = tcg_temp_new_i64(tcg_ctx);
  rh = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_mulu2_i64_riscv64(tcg_ctx,rl,rh,arg1,arg2);
  tcg_gen_sari_i64_riscv64(tcg_ctx,rl,arg1,0x3f);
  tcg_gen_and_i64_riscv64(tcg_ctx,rl,rl,arg2);
  tcg_gen_sub_i64(tcg_ctx,ret,rh,rl);
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(rl + (long)tcg_ctx));
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(rh + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_mulhsu(TCGContext *tcg_ctx, TCGv ret, TCGv arg1, TCGv arg2)
{
    TCGv rl = tcg_temp_new(tcg_ctx);
    TCGv rh = tcg_temp_new(tcg_ctx);

    tcg_gen_mulu2_tl(tcg_ctx, rl, rh, arg1, arg2);
    /* fix up for one negative */
    tcg_gen_sari_tl(tcg_ctx, rl, arg1, TARGET_LONG_BITS - 1);
    tcg_gen_and_tl(tcg_ctx, rl, rl, arg2);
    tcg_gen_sub_tl(tcg_ctx, ret, rh, rl);

    tcg_temp_free(tcg_ctx, rl);
    tcg_temp_free(tcg_ctx, rh);
}